

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treemodel.cpp
# Opt level: O0

UModelIndex * __thiscall
TreeModel::addItem(UModelIndex *__return_storage_ptr__,TreeModel *this,UINT32 offset,UINT8 type,
                  UINT8 subtype,CBString *name,CBString *text,CBString *info,UByteArray *header,
                  UByteArray *body,UByteArray *tail,ItemFixedState fixed,UModelIndex *parent,
                  UINT8 mode)

{
  TreeItem *name_00;
  UINT8 subtype_00;
  UINT8 type_00;
  UINT32 offset_00;
  bool bVar1;
  int row;
  TreeItem *this_00;
  TreeItem *newItem;
  int local_54;
  TreeItem *pTStack_50;
  int parentColumn;
  TreeItem *parentItem;
  TreeItem *item;
  CBString *name_local;
  UINT8 subtype_local;
  UINT8 type_local;
  TreeModel *pTStack_30;
  UINT32 offset_local;
  TreeModel *this_local;
  
  parentItem = (TreeItem *)0x0;
  pTStack_50 = (TreeItem *)0x0;
  local_54 = 0;
  item = (TreeItem *)name;
  name_local._2_1_ = subtype;
  name_local._3_1_ = type;
  name_local._4_4_ = offset;
  pTStack_30 = this;
  bVar1 = UModelIndex::isValid(parent);
  if (bVar1) {
    if ((mode == '\x02') || (mode == '\x03')) {
      parentItem = (TreeItem *)UModelIndex::internalPointer(parent);
      pTStack_50 = TreeItem::parent(parentItem);
      UModelIndex::parent((UModelIndex *)&newItem,parent);
      local_54 = UModelIndex::column((UModelIndex *)&newItem);
    }
    else {
      pTStack_50 = (TreeItem *)UModelIndex::internalPointer(parent);
      local_54 = UModelIndex::column(parent);
    }
  }
  else {
    pTStack_50 = this->rootItem;
  }
  this_00 = (TreeItem *)operator_new(0x118);
  offset_00 = name_local._4_4_;
  type_00 = name_local._3_1_;
  subtype_00 = name_local._2_1_;
  name_00 = item;
  bVar1 = compressed(this,parent);
  TreeItem::TreeItem(this_00,offset_00,type_00,subtype_00,(CBString *)name_00,text,info,header,body,
                     tail,false,bVar1,pTStack_50);
  if (mode == '\0') {
    layoutAboutToBeChanged(this);
    TreeItem::appendChild(pTStack_50,this_00);
  }
  else if (mode == '\x01') {
    layoutAboutToBeChanged(this);
    TreeItem::prependChild(pTStack_50,this_00);
  }
  else if (mode == '\x02') {
    layoutAboutToBeChanged(this);
    TreeItem::insertChildBefore(pTStack_50,parentItem,this_00);
  }
  else {
    if (mode != '\x03') {
      if (this_00 != (TreeItem *)0x0) {
        TreeItem::~TreeItem(this_00);
        operator_delete(this_00);
      }
      UModelIndex::UModelIndex(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    layoutAboutToBeChanged(this);
    TreeItem::insertChildAfter(pTStack_50,parentItem,this_00);
  }
  layoutChanged(this);
  row = TreeItem::row(this_00);
  createIndex(__return_storage_ptr__,this,row,local_54,this_00);
  setFixed(this,__return_storage_ptr__,fixed != Movable);
  return __return_storage_ptr__;
}

Assistant:

UModelIndex TreeModel::addItem(const UINT32 offset, const UINT8 type, const UINT8 subtype,
                               const UString & name, const UString & text, const UString & info,
                               const UByteArray & header, const UByteArray & body, const UByteArray & tail,
                               const ItemFixedState fixed,
                               const UModelIndex & parent, const UINT8 mode)
{
    TreeItem *item = 0;
    TreeItem *parentItem = 0;
    int parentColumn = 0;
    
    if (!parent.isValid())
        parentItem = rootItem;
    else
    {
        if (mode == CREATE_MODE_BEFORE || mode == CREATE_MODE_AFTER) {
            item = static_cast<TreeItem*>(parent.internalPointer());
            parentItem = item->parent();
            parentColumn = parent.parent().column();
        }
        else {
            parentItem = static_cast<TreeItem*>(parent.internalPointer());
            parentColumn = parent.column();
        }
    }
    
    TreeItem *newItem = new TreeItem(offset, type, subtype, name, text, info, header, body, tail, Movable, this->compressed(parent), parentItem);
    
    if (mode == CREATE_MODE_APPEND) {
        emit layoutAboutToBeChanged();
        parentItem->appendChild(newItem);
    }
    else if (mode == CREATE_MODE_PREPEND) {
        emit layoutAboutToBeChanged();
        parentItem->prependChild(newItem);
    }
    else if (mode == CREATE_MODE_BEFORE) {
        emit layoutAboutToBeChanged();
        parentItem->insertChildBefore(item, newItem);
    }
    else if (mode == CREATE_MODE_AFTER) {
        emit layoutAboutToBeChanged();
        parentItem->insertChildAfter(item, newItem);
    }
    else {
        delete newItem;
        return UModelIndex();
    }
    
    emit layoutChanged();
    
    UModelIndex created = createIndex(newItem->row(), parentColumn, newItem);
    setFixed(created, (bool)fixed); // Non-trivial logic requires additional call
    return created;
}